

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

int mz_deflateInit2(mz_streamp pStream,int level,int method,int window_bits,int mem_level,
                   int strategy)

{
  mz_uint mVar1;
  tdefl_status tVar2;
  tdefl_compressor *d;
  mz_uint comp_flags;
  tdefl_compressor *pComp;
  int strategy_local;
  int mem_level_local;
  int window_bits_local;
  int method_local;
  int level_local;
  mz_streamp pStream_local;
  
  mVar1 = tdefl_create_comp_flags_from_zip_params(level,window_bits,strategy);
  if (pStream == (mz_streamp)0x0) {
    pStream_local._4_4_ = -2;
  }
  else if ((((method == 8) && (0 < mem_level)) && (mem_level < 10)) &&
          ((window_bits == 0xf || (window_bits == -0xf)))) {
    pStream->data_type = 0;
    pStream->adler = 1;
    pStream->msg = (char *)0x0;
    pStream->reserved = 0;
    pStream->total_in = 0;
    pStream->total_out = 0;
    if (pStream->zalloc == (mz_alloc_func)0x0) {
      pStream->zalloc = def_alloc_func;
    }
    if (pStream->zfree == (mz_free_func)0x0) {
      pStream->zfree = def_free_func;
    }
    d = (tdefl_compressor *)(*pStream->zalloc)(pStream->opaque,1,0x4df78);
    if (d == (tdefl_compressor *)0x0) {
      pStream_local._4_4_ = -4;
    }
    else {
      pStream->state = (mz_internal_state *)d;
      tVar2 = tdefl_init(d,(tdefl_put_buf_func_ptr)0x0,(void *)0x0,mVar1 | 0x2000);
      if (tVar2 == TDEFL_STATUS_OKAY) {
        pStream_local._4_4_ = 0;
      }
      else {
        mz_deflateEnd(pStream);
        pStream_local._4_4_ = -10000;
      }
    }
  }
  else {
    pStream_local._4_4_ = -10000;
  }
  return pStream_local._4_4_;
}

Assistant:

int mz_deflateInit2(mz_streamp pStream, int level, int method, int window_bits, int mem_level, int strategy)
{
  tdefl_compressor *pComp;
  mz_uint comp_flags = TDEFL_COMPUTE_ADLER32 | tdefl_create_comp_flags_from_zip_params(level, window_bits, strategy);

  if (!pStream) return MZ_STREAM_ERROR;
  if ((method != MZ_DEFLATED) || ((mem_level < 1) || (mem_level > 9)) || ((window_bits != MZ_DEFAULT_WINDOW_BITS) && (-window_bits != MZ_DEFAULT_WINDOW_BITS))) return MZ_PARAM_ERROR;

  pStream->data_type = 0;
  pStream->adler = MZ_ADLER32_INIT;
  pStream->msg = NULL;
  pStream->reserved = 0;
  pStream->total_in = 0;
  pStream->total_out = 0;
  if (!pStream->zalloc) pStream->zalloc = def_alloc_func;
  if (!pStream->zfree) pStream->zfree = def_free_func;

  pComp = (tdefl_compressor *)pStream->zalloc(pStream->opaque, 1, sizeof(tdefl_compressor));
  if (!pComp)
    return MZ_MEM_ERROR;

  pStream->state = (struct mz_internal_state *)pComp;

  if (tdefl_init(pComp, NULL, NULL, comp_flags) != TDEFL_STATUS_OKAY)
  {
    mz_deflateEnd(pStream);
    return MZ_PARAM_ERROR;
  }

  return MZ_OK;
}